

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

any * __thiscall Omega_h::NegOp::eval(any *__return_storage_ptr__,NegOp *this,ExprEnv *env)

{
  Int dim;
  storage_union local_30;
  long local_20;
  
  dim = env->dim;
  (*((this->rhs).super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ExprOp[2])(&local_30);
  anon_unknown_41::neg(__return_storage_ptr__,dim,(any *)&local_30);
  if (local_20 != 0) {
    (**(code **)(local_20 + 8))(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

any NegOp::eval(ExprEnv& env) { return neg(env.dim, rhs->eval(env)); }